

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Problem_CGBG_FF::FilterObservationsForHouse
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Problem_CGBG_FF *this,Index hI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  Index typeI;
  pointer puVar1;
  const_reference pvVar2;
  const_reference this_00;
  reference pvVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> obsIndices;
  value_type local_6c;
  Problem_CGBG_FF *local_68;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  Scope *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = &this->_m_houseIndices_obs;
  uVar6 = 0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = this;
  local_58 = types;
  local_50 = tupleOfAgents;
  while( true ) {
    uVar5 = (ulong)uVar6;
    puVar1 = (local_50->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_50->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= uVar5) break;
    uVar4 = puVar1[uVar5];
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_58,uVar5);
    typeI = *pvVar2;
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::at(local_60,(ulong)uVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               (long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_6c);
    TypeIndexToObservationIndices
              (local_68,typeI,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    for (uVar4 = 0; uVar5 = (ulong)uVar4,
        uVar5 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2);
        uVar4 = uVar4 + 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,uVar5);
      if (*pvVar2 == hI) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,uVar5);
        local_6c = *pvVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (__return_storage_ptr__,&local_6c);
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    uVar6 = uVar6 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Problem_CGBG_FF::observation_t> Problem_CGBG_FF::FilterObservationsForHouse(
        Index hI,  
        const Scope& tupleOfAgents,
        const vector<Index>& types
    ) const
{
    vector<Problem_CGBG_FF::observation_t> allObservationsForHouse_hI;

    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents[i];
        Index typeI = types.at(i);
        //vector<Index> obsIndices = TypeIndexToObservationIndices(agI, typeAgI);
        const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
        vector<Index> obsIndices(obsHouseIndices.size());
        TypeIndexToObservationIndices(typeI, obsIndices);
#if DEBUGPROBS
        cout << "\tAgent " << agI << ", observations: " << SoftPrintVector(obsIndices) <<
            " for houses:" << SoftPrintVector(obsHouseIndices) << " (typeI="<<typeI<<")"<<endl;
#endif
 
        for(Index o=0; o < obsIndices.size(); o++)
            if(obsHouseIndices.at(o) == hI)
                allObservationsForHouse_hI.push_back(
                    (Problem_CGBG_FF::observation_t) obsIndices.at(o)
                    );
    }
    return allObservationsForHouse_hI;
}